

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_patchclose(FuncState *fs,int list,int level)

{
  Instruction *pIVar1;
  uint uVar2;
  long lVar3;
  
  if (list != -1) {
    pIVar1 = fs->f->code;
    do {
      lVar3 = (long)list;
      if (((char)pIVar1[lVar3] != '\x1e') ||
         (uVar2 = pIVar1[lVar3] >> 8 & 0x7f, (int)uVar2 <= level && uVar2 != 0)) {
        __assert_fail("((OpCode)(((fs->f->code[list])&0xff))) == OP_JMP && (((int)(((fs->f->code[list])>>8)&0x7f)) == 0 || ((int)(((fs->f->code[list])>>8)&0x7f)) >= level)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x125,"void luaK_patchclose(FuncState *, int, int)");
      }
      *(byte *)((long)pIVar1 + lVar3 * 4 + 1) = (byte)(level + 1U) & 0x7f;
      if (((byte)ravi_parser_debug & 2) != 0) {
        raviY_printf(fs,"[?]* %o ; set A to %d\n",(ulong)fs->f->code[lVar3],(ulong)(level + 1U));
      }
      pIVar1 = fs->f->code;
      uVar2 = (uint)*(ushort *)((long)pIVar1 + lVar3 * 4 + 2);
    } while ((uVar2 != 0x7fff) && (list = list + -0x7fff + uVar2, list != -1));
  }
  return;
}

Assistant:

void luaK_patchclose (FuncState *fs, int list, int level) {
  level++;  /* argument is +1 to reserve 0 as non-op */
  for (; list != NO_JUMP; list = getjump(fs, list)) {
    lua_assert(GET_OPCODE(fs->f->code[list]) == OP_JMP &&
                (GETARG_A(fs->f->code[list]) == 0 ||
                 GETARG_A(fs->f->code[list]) >= level));
    SETARG_A(fs->f->code[list], level);
    DEBUG_CODEGEN(raviY_printf(fs, "[?]* %o ; set A to %d\n", fs->f->code[list], level));
  }
}